

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O1

Scene * book_cover(void)

{
  Point3 look_from;
  Point3 look_at;
  Vec3 vup;
  int iVar1;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_double>
  __aurng;
  Scene *in_RDI;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  int iVar3;
  double dVar4;
  shared_ptr<Metal> material3;
  shared_ptr<Lambertian> material2;
  shared_ptr<Dielectric> material1;
  ObjectList objects;
  shared_ptr<Lambertian> ground_mat;
  Camera camera;
  shared_ptr<Metal> local_270;
  shared_ptr<Lambertian> local_260;
  undefined1 local_249;
  shared_ptr<Dielectric> local_248;
  undefined8 local_238;
  Sphere *local_230;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_228;
  _func_int **local_220;
  double local_218;
  double local_210;
  double local_208;
  double local_200;
  int local_1f4;
  _func_int **local_1f0;
  vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_> local_1e8;
  Scene *local_1d0;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  value_type local_1a8;
  value_type local_198;
  value_type local_188;
  shared_ptr<Lambertian> local_178;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  value_type local_138;
  value_type local_128;
  value_type local_118;
  value_type local_108;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  Camera local_e0;
  
  local_220 = (_func_int **)&PTR_hit_00110af0;
  local_1f0 = (_func_int **)&PTR_hit_00110af0;
  local_1e8.super__Vector_base<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_178.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  (local_178.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_178.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_178.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00110b60;
  local_178.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_178.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
  local_178.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR_scatter_00110c10;
  local_178.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = 0;
  local_178.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_weak_count = 0x3fe00000;
  local_178.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _vptr__Sp_counted_base = (_func_int **)0x3fe0000000000000;
  local_178.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _M_use_count = 0;
  local_178.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _M_weak_count = 0x3fe00000;
  local_e0.origin_.e[0] = 0.0;
  local_e0.origin_.e[1] = -1000.0;
  local_e0.origin_.e[2] = 0.0;
  local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,
                1000);
  local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Sphere,std::allocator<Sphere>,Vec3,int,std::shared_ptr<Lambertian>&>
            (&local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (Sphere **)&local_248,(allocator<Sphere> *)&local_270,&local_e0.origin_,
             (int *)&local_260,&local_178);
  local_108.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_108.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::push_back
            (&local_1e8,&local_108);
  if (local_108.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_1d0 = in_RDI;
  if (local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  iVar1 = -0xb;
  do {
    local_1c8 = (double)iVar1;
    iVar3 = -0xb;
    local_1f4 = iVar1;
    do {
      if (nrand()::distribution == '\0') {
        book_cover();
      }
      if (nrand()::generator == '\0') {
        book_cover();
      }
      local_1b0 = std::
                  generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                              *)nrand()::generator);
      local_1c0 = DAT_00111250;
      local_1b8 = nrand()::distribution;
      if (nrand()::distribution == '\0') {
        book_cover();
      }
      if (nrand()::generator == '\0') {
        book_cover();
      }
      local_208 = std::
                  generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                              *)nrand()::generator);
      local_218 = DAT_00111250;
      local_210 = nrand()::distribution;
      if (nrand()::distribution == '\0') {
        book_cover();
      }
      if (nrand()::generator == '\0') {
        book_cover();
      }
      dVar4 = std::
              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)nrand()::generator);
      local_e0.origin_.e[0] = (local_208 * (local_218 - local_210) + local_210) * 0.9 + local_1c8;
      local_e0.origin_.e[2] =
           (dVar4 * (DAT_00111250 - nrand()::distribution) + nrand()::distribution) * 0.9 +
           (double)iVar3;
      local_e0.origin_.e[1] = 0.2;
      dVar4 = local_e0.origin_.e[2] * local_e0.origin_.e[2] +
              (local_e0.origin_.e[0] + -4.0) * (local_e0.origin_.e[0] + -4.0) + 0.0;
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      if (2.0 < dVar4) {
        dVar4 = local_1b0 * (local_1c0 - local_1b8) + local_1b8;
        if (0.8 <= dVar4) {
          if (dVar4 < 0.95) {
            Vec3::random();
            if (nrand()::distribution == '\0') {
              book_cover();
            }
            if (nrand()::generator == '\0') {
              book_cover();
            }
            local_208 = std::
                        generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                                  ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                                    *)nrand()::generator);
            local_218 = DAT_00111250;
            local_210 = nrand()::distribution;
            local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
            (local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ->_M_use_count = 1;
            (local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ->_M_weak_count = 1;
            (local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00110c50;
            local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 (local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi + 1);
            local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            [1]._vptr__Sp_counted_base = (_func_int **)&PTR_scatter_00110ca0;
            *(element_type **)
             &local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              [1]._M_use_count =
                 local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            [2]._vptr__Sp_counted_base =
                 (_func_int **)
                 local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
            local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            [2]._M_use_count = (undefined4)local_238;
            local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            [2]._M_weak_count = local_238._4_4_;
            local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            [3]._vptr__Sp_counted_base =
                 (_func_int **)((local_208 * (local_218 - local_210) + local_210) * 0.5 + 0.0);
            local_230 = (Sphere *)0x3fc999999999999a;
            local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<Sphere,std::allocator<Sphere>,Vec3&,double,std::shared_ptr<Metal>&>
                      (&local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                       (Sphere **)&local_270,(allocator<Sphere> *)&local_200,&local_e0.origin_,
                       (double *)&local_230,(shared_ptr<Metal> *)&local_260);
            local_198.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_198.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::
            push_back(&local_1e8,&local_198);
            _Var2._M_pi = local_198.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
            goto LAB_0010890a;
          }
          local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
          (local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = 1;
          (local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_weak_count = 1;
          (local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00110cd0;
          local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               (local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi + 1);
          local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
          _vptr__Sp_counted_base = (_func_int **)&PTR_scatter_00110d20;
          local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
          _M_use_count = 0;
          local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
          _M_weak_count = 0x3ff80000;
          local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x3fc999999999999a;
          local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<Sphere,std::allocator<Sphere>,Vec3&,double,std::shared_ptr<Dielectric>&>
                    (&local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(Sphere **)&local_260,(allocator<Sphere> *)&local_230,
                     &local_e0.origin_,(double *)&local_270,&local_248);
          local_1a8.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_1a8.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
          local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::push_back
                    (&local_1e8,&local_1a8);
          if (local_1a8.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1a8.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi);
          }
          _Var2._M_pi = local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
          if (local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            _Var2._M_pi = local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
          }
        }
        else {
          Vec3::random();
          local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
          (local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = 1;
          (local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_weak_count = 1;
          (local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00110b60;
          local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               (local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi + 1);
          local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
          _vptr__Sp_counted_base = (_func_int **)&PTR_scatter_00110c10;
          *(element_type **)
           &local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            [1]._M_use_count =
               local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
          _vptr__Sp_counted_base =
               (_func_int **)
               local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
          local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
          _M_use_count = (undefined4)local_238;
          local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
          _M_weak_count = local_238._4_4_;
          local_230 = (Sphere *)0x3fc999999999999a;
          local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<Sphere,std::allocator<Sphere>,Vec3&,double,std::shared_ptr<Lambertian>&>
                    (&local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (Sphere **)&local_270,(allocator<Sphere> *)&local_200,&local_e0.origin_,
                     (double *)&local_230,&local_260);
          local_188.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_188.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::push_back
                    (&local_1e8,&local_188);
          _Var2._M_pi = local_188.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                        ._M_pi;
LAB_0010890a:
          if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
          }
          _Var2._M_pi = local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
          if (local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi);
            _Var2._M_pi = local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
          }
        }
        if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
        }
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != 0xb);
    iVar1 = local_1f4 + 1;
    if (iVar1 == 0xb) {
      local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
      (local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = 1;
      (local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count = 1;
      (local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00110cd0;
      local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
           1);
      local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _vptr__Sp_counted_base = (_func_int **)&PTR_scatter_00110d20;
      local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _M_use_count = 0;
      local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _M_weak_count = 0x3ff80000;
      local_e0.origin_.e[0] = 0.0;
      local_e0.origin_.e[1] = 1.0;
      local_e0.origin_.e[2] = 0.0;
      local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x3ff0000000000000;
      local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Sphere,std::allocator<Sphere>,Vec3,double,std::shared_ptr<Dielectric>&>
                (&local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (Sphere **)&local_260,(allocator<Sphere> *)&local_230,&local_e0.origin_,
                 (double *)&local_270,&local_248);
      local_118.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_118.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::push_back
                (&local_1e8,&local_118);
      if (local_118.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_118.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
      (local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = 1;
      (local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count = 1;
      (local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00110b60;
      local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
           1);
      local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _vptr__Sp_counted_base = (_func_int **)&PTR_scatter_00110c10;
      local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _M_use_count = -0x66666666;
      local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _M_weak_count = 0x3fd99999;
      local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
      _vptr__Sp_counted_base = (_func_int **)0x3fc999999999999a;
      local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
      _M_use_count = -0x66666666;
      local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
      _M_weak_count = 0x3fb99999;
      local_e0.origin_.e[0] = -4.0;
      local_e0.origin_.e[1] = 1.0;
      local_e0.origin_.e[2] = 0.0;
      local_230 = (Sphere *)0x3ff0000000000000;
      local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Sphere,std::allocator<Sphere>,Vec3,double,std::shared_ptr<Lambertian>&>
                (&local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (Sphere **)&local_270,(allocator<Sphere> *)&local_200,&local_e0.origin_,
                 (double *)&local_230,&local_260);
      local_128.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_128.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::push_back
                (&local_1e8,&local_128);
      if (local_128.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_128.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  );
      }
      local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
      (local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = 1;
      (local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count = 1;
      (local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00110c50;
      local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
      local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _vptr__Sp_counted_base = (_func_int **)&PTR_scatter_00110ca0;
      local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _M_use_count = 0x66666666;
      local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _M_weak_count = 0x3fe66666;
      local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
      _vptr__Sp_counted_base = (_func_int **)0x3fe3333333333333;
      local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
      _M_use_count = 0;
      local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
      _M_weak_count = 0x3fe00000;
      local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
      _vptr__Sp_counted_base = (_func_int **)0x0;
      local_e0.origin_.e[0] = 4.0;
      local_e0.origin_.e[1] = 1.0;
      local_e0.origin_.e[2] = 0.0;
      local_200 = 1.0;
      local_230 = (Sphere *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Sphere,std::allocator<Sphere>,Vec3,double,std::shared_ptr<Metal>&>
                (&_Stack_228,&local_230,(allocator<Sphere> *)&local_249,&local_e0.origin_,&local_200
                 ,&local_270);
      local_138.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &local_230->super_Object;
      local_138.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Stack_228._M_pi;
      local_230 = (Sphere *)0x0;
      _Stack_228._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::push_back
                (&local_1e8,&local_138);
      if (local_138.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_138.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (_Stack_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_228._M_pi);
      }
      local_150 = 0x4024000000000000;
      uStack_148 = 0x4000000000000000;
      local_140 = 0xc014000000000000;
      local_f8 = 0;
      uStack_f0 = 0;
      local_e8 = 0;
      local_168 = 0;
      uStack_160 = 0x3ff0000000000000;
      local_158 = 0;
      look_from.e[1] = 2.0;
      look_from.e[0] = 10.0;
      look_from.e[2] = -5.0;
      look_at.e[2] = 0.0;
      look_at.e[0] = 0.0;
      look_at.e[1] = 0.0;
      vup.e[2] = 0.0;
      vup.e[0] = (double)SUB168(ZEXT816(0x3ff0000000000000) << 0x40,0);
      vup.e[1] = (double)SUB168(ZEXT816(0x3ff0000000000000) << 0x40,8);
      Camera::Camera(&local_e0,look_from,look_at,vup,30.0,1.7777777777777777,0.1,10.0);
      (local_1d0->objects_).super_Object._vptr_Object = local_220;
      std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::vector
                (&(local_1d0->objects_).objects_,&local_1e8);
      memcpy(&local_1d0->camera_,&local_e0,0xb0);
      if (local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_270.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  );
      }
      if (local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_260.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_248.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_178.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_178.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      local_1f0 = local_220;
      std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::~vector
                (&local_1e8);
      return local_1d0;
    }
  } while( true );
}

Assistant:

Scene book_cover() {

  ObjectList objects;

  auto ground_mat = std::make_shared<Lambertian>(Color(0.5, 0.5, 0.5));
  objects.add(std::make_shared<Sphere>(Point3(0, -1000, 0), 1000, ground_mat));

  for (int a = -11; a < 11; a++) {
    for (int b = -11; b < 11; b++) {
      auto choose_mat = nrand();
      Point3 center{a + 0.9*nrand(), 0.2, b + 0.9*nrand()};

      if ((center - Vec3(4, 0.2, 0)).length() > 2.0) {
        if (choose_mat < 0.8) {
          Color albedo = Color::random(0, 1);
          auto sphere_material = std::make_shared<Lambertian>(albedo);
          objects.add(std::make_shared<Sphere>(center, 0.2, sphere_material));
        } else if (choose_mat < 0.95) {
          auto albedo = Color::random(0.5, 1);
          auto fuzz = nrand(0, 0.5);
          auto sphere_material = std::make_shared<Metal>(albedo, fuzz);
          objects.add(std::make_shared<Sphere>(center, 0.2, sphere_material));
        } else {
          // glass
          auto sphere_material = std::make_shared<Dielectric>(1.5);
          objects.add(std::make_shared<Sphere>(center, 0.2, sphere_material));
        }
      }
    }
  }

  auto material1 = std::make_shared<Dielectric>(1.5);
  objects.add(std::make_shared<Sphere>(Point3(0, 1, 0), 1.0, material1));

  auto material2 = std::make_shared<Lambertian>(Color(0.4, 0.2, 0.1));
  objects.add(std::make_shared<Sphere>(Point3(-4, 1, 0), 1.0, material2));

  auto material3 = std::make_shared<Metal>(Color(0.7, 0.6, 0.5), 0.0);
  objects.add(std::make_shared<Sphere>(Point3(4, 1, 0), 1.0, material3));

  // Setup camera
  Point3 camera_position{10, 2, -5};
  Point3 camera_target{0, 0, 0};
  double field_of_view = 30;
  double aperture = 0.1;
  double focal_dist = 10.0;

  Camera camera(camera_position,
                camera_target,
                Point3(0, 1, 0),
                field_of_view,
                ASPECT_RATIO,
                aperture,
                10.0);
  return {objects, camera};
}